

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::alloc_string(xpath_parser *this,xpath_lexer_string *value)

{
  long lVar1;
  long lVar2;
  long *in_RSI;
  size_t unaff_retaddr;
  xpath_allocator *in_stack_00000008;
  char_t *c;
  size_t length;
  char *local_8;
  
  if (*in_RSI == 0) {
    local_8 = "";
  }
  else {
    lVar1 = in_RSI[1];
    lVar2 = *in_RSI;
    local_8 = (char *)xpath_allocator::allocate(in_stack_00000008,unaff_retaddr);
    if (local_8 == (char *)0x0) {
      local_8 = (char *)0x0;
    }
    else {
      memcpy(local_8,(void *)*in_RSI,lVar1 - lVar2);
      local_8[lVar1 - lVar2] = '\0';
    }
  }
  return local_8;
}

Assistant:

const char_t* alloc_string(const xpath_lexer_string& value)
		{
			if (!value.begin)
				return PUGIXML_TEXT("");

			size_t length = static_cast<size_t>(value.end - value.begin);

			char_t* c = static_cast<char_t*>(_alloc->allocate((length + 1) * sizeof(char_t)));
			if (!c) return 0;

			memcpy(c, value.begin, length * sizeof(char_t));
			c[length] = 0;

			return c;
		}